

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jessilib::ustring_to_mbstring<char8_t>
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ulong __n;
  char8_t *pcVar3;
  size_t sVar4;
  char8_t *extraout_RDX;
  bool bVar5;
  char8_t *pcVar6;
  decode_result dVar7;
  undefined1 auVar8 [16];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  mbstate_t mbstate;
  char buffer [16];
  undefined8 local_50;
  char local_48 [24];
  
  pcVar3 = (char8_t *)in_string._M_len;
  bVar5 = false;
  __return_storage_ptr__->first = false;
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_50 = 0;
  pcVar6 = pcVar3;
  do {
    in_string_00._M_str = pcVar3;
    in_string_00._M_len = (size_t)pcVar6;
    dVar7 = decode_codepoint_utf8<char8_t>(this,in_string_00);
    sVar4 = dVar7.units;
    if (sVar4 == 0) {
      __return_storage_ptr__->first = true;
      return __return_storage_ptr__;
    }
    auVar8 = c32rtomb(local_48,dVar7.codepoint,&local_50);
    pcVar3 = auVar8._8_8_;
    __n = auVar8._0_8_;
    if (__n < 0x11) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&__return_storage_ptr__->second,local_48,__n);
      pcVar3 = extraout_RDX;
    }
    else {
      __return_storage_ptr__->first = false;
      bVar5 = true;
    }
    pcVar6 = pcVar6 + sVar4;
    this = this + -sVar4;
  } while (__n < 0x11);
  if ((!bVar5) &&
     (pcVar2 = (__return_storage_ptr__->second)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != paVar1)) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}